

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                 (UnknownFieldSet *unknown_fields)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  pointer pUVar2;
  int iVar3;
  int iVar4;
  anon_union_8_5_912831f5_for_data_ *paVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  
  pvVar1 = unknown_fields->fields_;
  sVar10 = 0;
  if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    pUVar2 = (pvVar1->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (ulong)((long)(pvVar1->
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) >> 4;
    uVar7 = uVar6 & 0xffffffff;
    if (0 < (int)uVar6) {
      paVar5 = &pUVar2->data_;
      sVar10 = 0;
      do {
        if (*(uint32 *)((long)paVar5 + -4) == 3) {
          uVar8 = ((UnknownField *)(paVar5 + -1))->number_ | 1;
          iVar3 = 0x1f;
          if (uVar8 != 0) {
            for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          uVar8 = (uint)*(undefined8 *)(paVar5->varint_ + 8);
          uVar9 = uVar8 | 1;
          iVar4 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> iVar4 == 0; iVar4 = iVar4 + -1) {
            }
          }
          sVar10 = (long)(int)uVar8 + sVar10 + 4 + (ulong)(iVar3 * 9 + 0x49U >> 6) +
                   (ulong)(iVar4 * 9 + 0x49U >> 6);
        }
        paVar5 = paVar5 + 2;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
  }
  return sVar10;
}

Assistant:

size_t WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}